

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

char * phosg::Image::mime_type_for_format(Format format)

{
  if (format < 4) {
    return &DAT_0011de50 + *(int *)(&DAT_0011de50 + (ulong)format * 4);
  }
  return "text/plain";
}

Assistant:

const char* Image::mime_type_for_format(Format format) {
  switch (format) {
    case Format::GRAYSCALE_PPM:
    case Format::COLOR_PPM:
      return "image/x-portable-pixmap";
    case Format::WINDOWS_BITMAP:
      return "image/bmp";
    case Format::PNG:
      return "image/png";
    default:
      return "text/plain";
  }
}